

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

SUNErrCode SUNMatScaleAdd_Dense(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  plVar1 = (long *)A->content;
  lVar3 = plVar1[1];
  if (plVar1[1] < 1) {
    lVar3 = 0;
  }
  for (lVar4 = 0; lVar4 != lVar3; lVar4 = lVar4 + 1) {
    lVar5 = *plVar1;
    if (*plVar1 < 1) {
      lVar5 = 0;
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      lVar2 = *(long *)(plVar1[4] + lVar4 * 8);
      *(double *)(lVar2 + lVar6 * 8) =
           *(double *)(lVar2 + lVar6 * 8) * c +
           *(double *)(*(long *)(*(long *)((long)B->content + 0x20) + lVar4 * 8) + lVar6 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAdd_Dense(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation A = c*A + B */
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    for (i = 0; i < SM_ROWS_D(A); i++)
    {
      SM_ELEMENT_D(A, i, j) = c * SM_ELEMENT_D(A, i, j) + SM_ELEMENT_D(B, i, j);
    }
  }

  return SUN_SUCCESS;
}